

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall IRBuilder::SetLoopBodyStSlot(IRBuilder *this,SymID symID,bool isCatchObjectSym)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint sourceContextId;
  uint functionId;
  BVIndex BVar4;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  undefined4 *puVar5;
  StackSym *pSVar6;
  
  BVar3 = Func::HasTry(this->m_func);
  if (BVar3 != 0) {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015a4e90,JITLoopBodyInTryCatchPhase,sourceContextId,functionId
                      );
    if (!bVar2) {
      if (isCatchObjectSym) {
        return;
      }
      pSVar6 = StackSym::FindOrCreate(symID,symID,this->m_func,TyVar);
      if (pSVar6 == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                           ,0x10f7,"(dstSym)","dstSym");
        if (!bVar2) goto LAB_004c93c2;
        *puVar5 = 0;
      }
      if ((pSVar6->field_0x1b & 8) != 0) {
        return;
      }
    }
  }
  BVar4 = BVFixed::Length(this->m_stSlots);
  if (BVar4 <= symID) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x10fd,"(symID < m_stSlots->Length())","symID < m_stSlots->Length()");
    if (!bVar2) {
LAB_004c93c2:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  BVFixed::Set(this->m_stSlots,symID);
  return;
}

Assistant:

void
IRBuilder::SetLoopBodyStSlot(SymID symID, bool isCatchObjectSym)
{
    if (this->m_func->HasTry() && !PHASE_OFF(Js::JITLoopBodyInTryCatchPhase, this->m_func))
    {
        // No need to emit StSlot for a catch object. In fact, if we do, we might be storing an uninitialized value to the slot.
        if (isCatchObjectSym)
        {
            return;
        }
        StackSym * dstSym = StackSym::FindOrCreate(symID, (Js::RegSlot)symID, m_func);
        Assert(dstSym);
        if (dstSym->m_isCatchObjectSym)
        {
            return;
        }
    }
    AssertOrFailFast(symID < m_stSlots->Length());
    this->m_stSlots->Set(symID);
}